

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raytri.cpp
# Opt level: O2

bool lineIntersectsTriangle(float *rayStart,float *rayEnd,float *p1,float *p2,float *p3,float *sect)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float fVar9;
  undefined1 auVar10 [16];
  float t;
  float local_4c;
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  undefined8 local_20;
  float local_18;
  
  local_38._8_8_ = 0;
  local_38._0_8_ = *(ulong *)rayStart;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)rayEnd;
  fVar5 = rayEnd[2] - rayStart[2];
  auVar7 = vsubps_avx(auVar8,local_38);
  fVar1 = auVar7._0_4_;
  auVar10._0_4_ = fVar1 * fVar1;
  fVar2 = auVar7._4_4_;
  auVar10._4_4_ = fVar2 * fVar2;
  fVar3 = auVar7._8_4_;
  auVar10._8_4_ = fVar3 * fVar3;
  fVar4 = auVar7._12_4_;
  auVar10._12_4_ = fVar4 * fVar4;
  auVar8 = vmovshdup_avx(auVar10);
  auVar8 = vfmadd231ss_fma(auVar8,auVar7,auVar7);
  auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)fVar5),ZEXT416((uint)fVar5));
  auVar8 = vsqrtss_avx(auVar8,auVar8);
  fVar9 = 1.0 / auVar8._0_4_;
  local_48._0_4_ = fVar1 * fVar9;
  local_48._4_4_ = fVar2 * fVar9;
  local_48._8_4_ = fVar3 * fVar9;
  local_48._12_4_ = fVar4 * fVar9;
  local_20 = vmovlps_avx(local_48);
  local_18 = fVar5 * fVar9;
  bVar6 = rayIntersectsTriangle(rayStart,(float *)&local_20,p1,p2,p3,&local_4c);
  if ((!bVar6) || (local_4c <= auVar8._0_4_)) {
    bVar6 = false;
  }
  else {
    bVar6 = true;
    auVar7 = ZEXT416((uint)local_4c);
    auVar8 = vfmadd231ss_fma(local_38,local_48,auVar7);
    *sect = auVar8._0_4_;
    auVar8 = vmovshdup_avx(local_48);
    auVar8 = vfmadd213ss_fma(auVar8,auVar7,ZEXT416((uint)rayStart[1]));
    sect[1] = auVar8._0_4_;
    auVar8 = vfmadd213ss_fma(ZEXT416((uint)(fVar5 * fVar9)),auVar7,ZEXT416((uint)rayStart[2]));
    sect[2] = auVar8._0_4_;
  }
  return bVar6;
}

Assistant:

bool lineIntersectsTriangle(const float *rayStart,const float *rayEnd,const float *p1,const float *p2,const float *p3,float *sect)
{
	float dir[3];

  dir[0] = rayEnd[0] - rayStart[0];
  dir[1] = rayEnd[1] - rayStart[1];
  dir[2] = rayEnd[2] - rayStart[2];

  float d = sqrtf(dir[0]*dir[0] + dir[1]*dir[1] + dir[2]*dir[2]);
  float r = 1.0f / d;

  dir[0]*=r;
  dir[1]*=r;
  dir[2]*=r;


  float t;

	bool ret = rayIntersectsTriangle(rayStart, dir, p1, p2, p3, t );

	if ( ret )
	{
		if ( t > d )
		{
			sect[0] = rayStart[0] + dir[0]*t;
			sect[1] = rayStart[1] + dir[1]*t;
			sect[2] = rayStart[2] + dir[2]*t;
		}
		else
		{
			ret = false;
		}
	}

  return ret;
}